

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O0

BOOL CreatePipe(PHANDLE hReadPipe,PHANDLE hWritePipe,LPSECURITY_ATTRIBUTES lpPipeAttributes,
               DWORD nSize)

{
  PAL_ERROR dwLastError;
  CPalThread *pThread_00;
  CPalThread *pThread;
  PAL_ERROR palError;
  DWORD nSize_local;
  LPSECURITY_ATTRIBUTES lpPipeAttributes_local;
  PHANDLE hWritePipe_local;
  PHANDLE hReadPipe_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pThread_00 = CorUnix::InternalGetCurrentThread();
  dwLastError = CorUnix::InternalCreatePipe(pThread_00,hReadPipe,hWritePipe,lpPipeAttributes,nSize);
  if (dwLastError != 0) {
    CorUnix::CPalThread::SetLastError(dwLastError);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return (BOOL)(dwLastError == 0);
}

Assistant:

PALIMPORT
BOOL
PALAPI
CreatePipe(
        OUT PHANDLE hReadPipe,
        OUT PHANDLE hWritePipe,
        IN LPSECURITY_ATTRIBUTES lpPipeAttributes,
        IN DWORD nSize)
{
    PAL_ERROR palError;
    CPalThread *pThread;

    PERF_ENTRY(CreatePipe);
    ENTRY("CreatePipe(hReadPipe:%p, hWritePipe:%p, lpPipeAttributes:%p, nSize:%d\n",
          hReadPipe, hWritePipe, lpPipeAttributes, nSize);

    pThread = InternalGetCurrentThread();

    palError = InternalCreatePipe(
        pThread,
        hReadPipe,
        hWritePipe,
        lpPipeAttributes,
        nSize
        );

    if (NO_ERROR != palError)
    {
        pThread->SetLastError(palError);
    }

    LOGEXIT("CreatePipe return %s\n", NO_ERROR == palError ? "TRUE":"FALSE");
    PERF_EXIT(CreatePipe);
    return NO_ERROR == palError;
}